

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O2

char * helicsFederateWaitCommand(HelicsFederate fed,HelicsError *err)

{
  FedObject *pFVar1;
  string *this;
  _Alloc_hider _Var2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  res;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  
  pFVar1 = helics::getFedObject(fed,err);
  _Var2 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
  if (pFVar1 != (FedObject *)0x0) {
    helics::Federate::waitCommand_abi_cxx11_
              (&local_50,
               (pFVar1->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    if (local_50.first._M_string_length == 0) {
      this = &gHelicsEmptyStr_abi_cxx11_;
    }
    else {
      this = &(pFVar1->commandBuffer).first;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator=((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)this,&local_50);
    }
    _Var2._M_p = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &this->_M_dataplus)->_M_dataplus)._M_p;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_50);
  }
  return _Var2._M_p;
}

Assistant:

const char* helicsFederateWaitCommand(HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = helics::getFedObject(fed, err);

    if (fedObj == nullptr) {
        return gHelicsEmptyStr.c_str();
    }
    auto res = fedObj->fedptr->waitCommand();
    if (res.first.empty()) {
        return gHelicsEmptyStr.c_str();
    }
    fedObj->commandBuffer = std::move(res);
    return fedObj->commandBuffer.first.c_str();
}